

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

TagAlias * __thiscall Catch::TagAliasRegistry::find(TagAliasRegistry *this,string *alias)

{
  bool bVar1;
  pointer ppVar2;
  const_iterator it;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>_>
  *in_stack_ffffffffffffffc8;
  _Self local_28;
  _Self local_20 [3];
  TagAlias *local_8;
  
  local_20[0]._M_node =
       (_Base_ptr)
       clara::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>_>
       ::find(in_stack_ffffffffffffffc8,(key_type *)0x136aa6);
  local_28._M_node =
       (_Base_ptr)
       clara::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>_>
       ::end(in_stack_ffffffffffffffc8);
  bVar1 = clara::std::operator!=(local_20,&local_28);
  if (bVar1) {
    ppVar2 = clara::std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>
                           *)0x136add);
    local_8 = &ppVar2->second;
  }
  else {
    local_8 = (TagAlias *)0x0;
  }
  return local_8;
}

Assistant:

TagAlias const* TagAliasRegistry::find( std::string const& alias ) const {
        auto it = m_registry.find( alias );
        if( it != m_registry.end() )
            return &(it->second);
        else
            return nullptr;
    }